

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O1

optional<pbrt::LightLiSample> * __thiscall
pbrt::DistantLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,DistantLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar10;
  float fVar11;
  float fVar13;
  undefined1 auVar8 [16];
  undefined1 auVar12 [56];
  undefined1 auVar9 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [56];
  undefined1 auVar16 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  SampledSpectrum SVar21;
  
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)),
                           ZEXT816(0) << 0x40,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
  fVar4 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][2];
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1),
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar14._0_4_ = auVar8._0_4_ * 0.0;
  auVar14._4_4_ = auVar8._4_4_ * 0.0;
  auVar14._8_4_ = auVar8._8_4_ * 0.0;
  auVar14._12_4_ = auVar8._12_4_ * 0.0;
  auVar8 = vinsertps_avx((undefined1  [16])(this->super_LightBase).renderFromLight.m.m[0],
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),0x10);
  auVar14 = vfmadd213ps_fma(auVar8,ZEXT816(0) << 0x40,auVar14);
  auVar8 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2),
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]),0x10);
  fVar6 = auVar8._0_4_ + auVar14._0_4_;
  fVar10 = auVar8._4_4_ + auVar14._4_4_;
  fVar11 = auVar8._8_4_ + auVar14._8_4_;
  fVar13 = auVar8._12_4_ + auVar14._12_4_;
  auVar8._0_4_ = fVar6 * fVar6;
  auVar8._4_4_ = fVar10 * fVar10;
  auVar8._8_4_ = fVar11 * fVar11;
  auVar8._12_4_ = fVar13 * fVar13;
  auVar8 = vhaddps_avx(auVar8,auVar8);
  fVar7 = auVar8._0_4_ + fVar4 * fVar4;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    auVar8 = vsqrtss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
    fVar7 = auVar8._0_4_;
  }
  auVar17 = (undefined1  [56])0x0;
  fVar1 = this->sceneRadius;
  fVar2 = this->scale;
  auVar12 = (undefined1  [56])0x0;
  SVar21 = DenselySampledSpectrum::Sample(&this->Lemit,&lambda);
  auVar16._0_8_ = SVar21.values.values._8_8_;
  auVar16._8_56_ = auVar17;
  auVar9._0_8_ = SVar21.values.values._0_8_;
  auVar9._8_56_ = auVar12;
  auVar14 = vmovlhps_avx(auVar9._0_16_,auVar16._0_16_);
  fVar1 = fVar1 + fVar1;
  auVar20._4_4_ = fVar7;
  auVar20._0_4_ = fVar7;
  auVar20._8_4_ = fVar7;
  auVar20._12_4_ = fVar7;
  auVar5._4_4_ = fVar10;
  auVar5._0_4_ = fVar6;
  auVar5._8_4_ = fVar11;
  auVar5._12_4_ = fVar13;
  auVar8 = vdivps_avx(auVar5,auVar20);
  fVar6 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
          ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) *
          0.5 + auVar8._0_4_ * fVar1;
  auVar5 = vmovshdup_avx(auVar8);
  fVar10 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
           ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) *
           0.5 + auVar5._0_4_ * fVar1;
  fVar11 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
           ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
           0.5 + (fVar4 / fVar7) * fVar1;
  auVar18._4_4_ = fVar6;
  auVar18._0_4_ = fVar6;
  auVar18._8_4_ = fVar6;
  auVar18._12_4_ = fVar6;
  auVar19._4_4_ = fVar10;
  auVar19._0_4_ = fVar10;
  auVar19._8_4_ = fVar10;
  auVar19._12_4_ = fVar10;
  auVar5 = vmovlhps_avx(auVar18,auVar19);
  auVar15._4_4_ = fVar11;
  auVar15._0_4_ = fVar11;
  auVar15._8_4_ = fVar11;
  auVar15._12_4_ = fVar11;
  *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x38) = ZEXT432(0) << 0x20;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  __return_storage_ptr__->set = true;
  *(float *)&__return_storage_ptr__->optionalValue = auVar14._0_4_ * fVar2;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 4) = auVar14._4_4_ * fVar2;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = auVar14._8_4_ * fVar2;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = auVar14._12_4_ * fVar2;
  uVar3 = vmovlps_avx(auVar8);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar3;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar4 / fVar7;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar5;
  uVar3 = vmovlps_avx(auVar15);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar3;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       &(this->super_LightBase).mediumInterface;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<LightLiSample> SampleLi(LightSampleContext ctx, Point2f u,
                                           SampledWavelengths lambda,
                                           LightSamplingMode mode) const {
        Vector3f wi = Normalize(renderFromLight(Vector3f(0, 0, 1)));
        Point3f pOutside = ctx.p() + wi * (2 * sceneRadius);
        return LightLiSample(scale * Lemit.Sample(lambda), wi, 1,
                             Interaction(pOutside, &mediumInterface));
    }